

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cbaNtk.c
# Opt level: O3

int Cba_NtkIsTopoOrder(Cba_Ntk_t *p)

{
  uint *puVar1;
  byte bVar2;
  uint uVar3;
  int iVar4;
  int iVar5;
  int *piVar6;
  bool bVar7;
  bool bVar8;
  uint uVar9;
  void *__s;
  long lVar10;
  long lVar11;
  ulong uVar12;
  ulong uVar13;
  int iVar14;
  uint uVar15;
  size_t __size;
  
  uVar9 = (p->vObjType).nSize;
  uVar12 = (ulong)uVar9;
  iVar14 = (((int)uVar9 >> 5) + 1) - (uint)((uVar9 & 0x1f) == 0);
  if (iVar14 == 0) {
    __size = 0;
    __s = (void *)0x0;
  }
  else {
    __size = (long)iVar14 << 2;
    __s = malloc(__size);
  }
  uVar15 = iVar14 * 0x20;
  memset(__s,0,__size);
  lVar10 = (long)(p->vInputs).nSize;
  if (0 < lVar10) {
    piVar6 = (p->vInputs).pArray;
    lVar11 = 0;
    do {
      uVar3 = piVar6[lVar11];
      if (((int)uVar3 < 0) || ((int)uVar15 <= (int)uVar3)) goto LAB_003d4e6c;
      puVar1 = (uint *)((long)__s + (ulong)(uVar3 >> 5) * 4);
      *puVar1 = *puVar1 | 1 << ((byte)uVar3 & 0x1f);
      lVar11 = lVar11 + 1;
    } while (lVar10 != lVar11);
  }
  lVar10 = (long)(p->vSeq).nSize;
  if (0 < lVar10) {
    piVar6 = (p->vSeq).pArray;
    lVar11 = 0;
    do {
      uVar3 = piVar6[lVar11];
      if (((int)uVar3 < 0) || ((int)uVar15 <= (int)uVar3)) goto LAB_003d4e6c;
      puVar1 = (uint *)((long)__s + (ulong)(uVar3 >> 5) * 4);
      *puVar1 = *puVar1 | 1 << ((byte)uVar3 & 0x1f);
      lVar11 = lVar11 + 1;
    } while (lVar10 != lVar11);
  }
  if (1 < (int)uVar9) {
    uVar13 = 1;
    do {
      if ((long)(int)uVar12 <= (long)uVar13) {
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecStr.h"
                      ,0x164,"char Vec_StrEntry(Vec_Str_t *, int)");
      }
      bVar2 = (p->vObjType).pArray[uVar13];
      if (0xffffffa8 < bVar2 - 0x5a) {
        if (bVar2 == 3) {
          Vec_IntFillExtra(&p->vObjFunc,(int)uVar13 + 1,0);
          if ((long)(p->vObjFunc).nSize <= (long)uVar13) goto LAB_003d4e0f;
          uVar9 = *(uint *)((long)(p->pDesign->vNtks).pArray[(uint)(p->vObjFunc).pArray[uVar13]] +
                           0x14) >> 2 & 1;
        }
        else {
          uVar9 = (uint)(bVar2 - 0x4c < 0xc);
        }
        if (uVar9 == 0) {
          lVar10 = (long)(p->vObjFin0).nSize;
          if ((lVar10 <= (long)uVar13) || (lVar10 <= (long)(uVar13 + 1))) goto LAB_003d4e0f;
          piVar6 = (p->vObjFin0).pArray;
          uVar9 = piVar6[uVar13];
          uVar12 = (ulong)uVar9;
          iVar14 = piVar6[uVar13 + 1];
          if ((int)uVar9 < iVar14) {
            bVar8 = true;
            do {
              if ((int)uVar9 < 1) goto LAB_003d4e2e;
              if ((p->vFinFon).nSize <= (int)uVar12) goto LAB_003d4e0f;
              iVar4 = (p->vFinFon).pArray[uVar12];
              bVar7 = bVar8;
              if (0 < (long)iVar4) {
                if ((p->vFonObj).nSize <= iVar4) goto LAB_003d4e0f;
                uVar3 = (p->vFonObj).pArray[iVar4];
                if (uVar3 != 0) {
                  if (((int)uVar3 < 0) || ((int)uVar15 <= (int)uVar3)) goto LAB_003d4e4d;
                  bVar7 = false;
                  if ((*(uint *)((long)__s + (ulong)(uVar3 >> 5) * 4) >> (uVar3 & 0x1f) & 1) != 0) {
                    bVar7 = bVar8;
                  }
                }
              }
              uVar12 = uVar12 + 1;
              bVar8 = bVar7;
            } while ((int)uVar12 < iVar14);
            if (!bVar7) goto LAB_003d4def;
          }
          if (uVar15 <= uVar13) {
LAB_003d4e6c:
            __assert_fail("i >= 0 && i < p->nSize",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecBit.h"
                          ,0x132,"void Vec_BitWriteEntry(Vec_Bit_t *, int, int)");
          }
          puVar1 = (uint *)((long)__s + (uVar13 >> 5 & 0x7ffffff) * 4);
          *puVar1 = *puVar1 | 1 << ((byte)uVar13 & 0x1f);
        }
      }
      uVar13 = uVar13 + 1;
      uVar12 = (ulong)(p->vObjType).nSize;
    } while ((long)uVar13 < (long)uVar12);
  }
  lVar10 = (long)(p->vOutputs).nSize;
  if (0 < lVar10) {
    lVar11 = 0;
    do {
      uVar9 = (p->vOutputs).pArray[lVar11];
      if ((int)uVar9 < 1) goto LAB_003d4e8b;
      uVar3 = (p->vObjFin0).nSize;
      if (((int)uVar3 <= (int)uVar9) || (uVar3 <= uVar9 + 1)) goto LAB_003d4e0f;
      piVar6 = (p->vObjFin0).pArray;
      uVar3 = piVar6[uVar9];
      uVar12 = (ulong)uVar3;
      iVar14 = piVar6[(ulong)uVar9 + 1];
      if ((int)uVar3 < iVar14) {
        bVar8 = true;
        do {
          if ((int)uVar3 < 1) goto LAB_003d4e2e;
          if ((p->vFinFon).nSize <= (int)uVar12) goto LAB_003d4e0f;
          iVar4 = (p->vFinFon).pArray[uVar12];
          bVar7 = bVar8;
          if (0 < (long)iVar4) {
            if ((p->vFonObj).nSize <= iVar4) goto LAB_003d4e0f;
            uVar9 = (p->vFonObj).pArray[iVar4];
            if (uVar9 != 0) {
              if (((int)uVar9 < 0) || ((int)uVar15 <= (int)uVar9)) goto LAB_003d4e4d;
              bVar7 = false;
              if ((*(uint *)((long)__s + (ulong)(uVar9 >> 5) * 4) >> (uVar9 & 0x1f) & 1) != 0) {
                bVar7 = bVar8;
              }
            }
          }
          uVar12 = uVar12 + 1;
          bVar8 = bVar7;
        } while ((int)uVar12 < iVar14);
        if (!bVar7) goto LAB_003d4def;
      }
      lVar11 = lVar11 + 1;
    } while (lVar11 != lVar10);
  }
  lVar10 = (long)(p->vSeq).nSize;
  iVar14 = 1;
  if (0 < lVar10) {
    lVar11 = 0;
    do {
      uVar9 = (p->vSeq).pArray[lVar11];
      if ((int)uVar9 < 1) {
LAB_003d4e8b:
        __assert_fail("i>0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/cba/cba.h"
                      ,0xe7,"int Cba_ObjFin0(Cba_Ntk_t *, int)");
      }
      uVar3 = (p->vObjFin0).nSize;
      if (((int)uVar3 <= (int)uVar9) || (uVar3 <= uVar9 + 1)) {
LAB_003d4e0f:
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                      ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
      }
      piVar6 = (p->vObjFin0).pArray;
      uVar3 = piVar6[uVar9];
      uVar12 = (ulong)uVar3;
      iVar4 = piVar6[(ulong)uVar9 + 1];
      if ((int)uVar3 < iVar4) {
        bVar8 = true;
        do {
          if ((int)uVar3 < 1) {
LAB_003d4e2e:
            __assert_fail("f>0",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/cba/cba.h"
                          ,0xfc,"int Cba_FinFon(Cba_Ntk_t *, int)");
          }
          if ((p->vFinFon).nSize <= (int)uVar12) goto LAB_003d4e0f;
          iVar5 = (p->vFinFon).pArray[uVar12];
          bVar7 = bVar8;
          if (0 < (long)iVar5) {
            if ((p->vFonObj).nSize <= iVar5) goto LAB_003d4e0f;
            uVar9 = (p->vFonObj).pArray[iVar5];
            if (uVar9 != 0) {
              if (((int)uVar9 < 0) || ((int)uVar15 <= (int)uVar9)) {
LAB_003d4e4d:
                __assert_fail("i >= 0 && i < p->nSize",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecBit.h"
                              ,0x121,"int Vec_BitEntry(Vec_Bit_t *, int)");
              }
              bVar7 = false;
              if ((*(uint *)((long)__s + (ulong)(uVar9 >> 5) * 4) >> (uVar9 & 0x1f) & 1) != 0) {
                bVar7 = bVar8;
              }
            }
          }
          uVar12 = uVar12 + 1;
          bVar8 = bVar7;
        } while ((int)uVar12 < iVar4);
        if (!bVar7) goto LAB_003d4def;
      }
      lVar11 = lVar11 + 1;
    } while (lVar11 != lVar10);
  }
LAB_003d4df1:
  if (__s != (void *)0x0) {
    free(__s);
  }
  return iVar14;
LAB_003d4def:
  iVar14 = 0;
  goto LAB_003d4df1;
}

Assistant:

int Cba_NtkIsTopoOrder( Cba_Ntk_t * p )
{
    int i, k, iObj, iFin, iFanin, fTopo = 1;
    Vec_Bit_t * vVisited = Vec_BitStart( Cba_NtkObjNum(p) + 1 );
    // mark PIs and seq objects
    Cba_NtkForEachPi( p, iObj, i )
        Vec_BitWriteEntry( vVisited, iObj, 1 );
    Cba_NtkForEachBoxSeq( p, iObj, i )
        Vec_BitWriteEntry( vVisited, iObj, 1 );
    // visit combinational nodes
    Cba_NtkForEachBox( p, iObj )
        if ( !Cba_ObjIsSeq(p, iObj) )
        {
            Cba_ObjForEachFinFaninReal( p, iObj, iFin, iFanin, k )
                if ( !Vec_BitEntry(vVisited, iFanin) )
                    fTopo = 0;
            if ( !fTopo )
                break;
            Vec_BitWriteEntry( vVisited, iObj, 1 );
        }
    // visit POs and seq objects
    if ( fTopo )
    Cba_NtkForEachPo( p, iObj, i )
    {
        Cba_ObjForEachFinFaninReal( p, iObj, iFin, iFanin, k )
            if ( !Vec_BitEntry(vVisited, iFanin) )
                fTopo = 0;
        if ( !fTopo )
            break;
    }
    if ( fTopo )
    Cba_NtkForEachBoxSeq( p, iObj, i )
    {
        Cba_ObjForEachFinFaninReal( p, iObj, iFin, iFanin, k )
            if ( !Vec_BitEntry(vVisited, iFanin) )
                fTopo = 0;
        if ( !fTopo )
            break;
    }
    Vec_BitFree( vVisited );
    return fTopo;
}